

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

ssize_t __thiscall
Omega_h::HostWrite<long>::write(HostWrite<long> *this,int __fd,void *__buf,size_t __n)

{
  Alloc *pAVar1;
  undefined4 in_register_00000034;
  ScopedTimer timer;
  ScopedTimer local_11;
  
  begin_code("array host to device",(char *)0x0);
  pAVar1 = *(Alloc **)CONCAT44(in_register_00000034,__fd);
  (this->write_).shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->write_).shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->write_).shared_alloc_.direct_ptr =
       (void *)((ulong *)CONCAT44(in_register_00000034,__fd))[1];
  ScopedTimer::~ScopedTimer(&local_11);
  return (ssize_t)this;
}

Assistant:

Write<T> HostWrite<T>::write() const {
  ScopedTimer timer("array host to device");
#ifdef OMEGA_H_USE_KOKKOS
  Kokkos::deep_copy(write_.view(), mirror_);
#elif defined(OMEGA_H_USE_CUDA)
  auto const err = cudaMemcpy(write_.data(), mirror_.get(),
      std::size_t(size()) * sizeof(T), cudaMemcpyHostToDevice);
  OMEGA_H_CHECK(err == cudaSuccess);
#endif
  return write_;
}